

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginQuery
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t query,VkQueryControlFlags flags,
          uint32_t queryFlag)

{
  uint32_t *puVar1;
  undefined4 in_register_0000000c;
  VkCommandBuffer pVVar2;
  string _msg;
  
  if ((((this->m_State).OutsidePassQueries | (this->m_State).InsidePassQueries) & queryFlag) == 0) {
    pVVar2 = this->m_VkCmdBuffer;
    if (pVVar2 == (VkCommandBuffer)0x0) {
      Diligent::FormatString<char[26],char[32]>
                (&_msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
                 (char (*) [32])CONCAT44(in_register_0000000c,flags));
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x260);
      std::__cxx11::string::~string((string *)&_msg);
      pVVar2 = this->m_VkCmdBuffer;
    }
    (*vkCmdBeginQuery)(pVVar2,queryPool,query,flags);
    if (((this->m_State).RenderPass == (VkRenderPass)0x0) &&
       ((this->m_State).DynamicRenderingHash == 0)) {
      puVar1 = &(this->m_State).OutsidePassQueries;
      *puVar1 = *puVar1 | queryFlag;
    }
    else {
      puVar1 = &(this->m_State).InsidePassQueries;
      *puVar1 = *puVar1 | queryFlag;
    }
  }
  else {
    Diligent::FormatString<char[148]>
              (&_msg,(char (*) [148])
                     "Another query of the same type is already active in the command buffer. Overlapping queries are not allowed in Vulkan. The command will be ignored."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  return;
}

Assistant:

__forceinline void BeginQuery(VkQueryPool         queryPool,
                                  uint32_t            query,
                                  VkQueryControlFlags flags,
                                  uint32_t            queryFlag)
    {
        // queryPool must have been created with a queryType that differs from that of any queries that
        // are active within commandBuffer (17.2). In other words, only one query of given type can be active
        // in the command buffer.

        if ((m_State.InsidePassQueries | m_State.OutsidePassQueries) & queryFlag)
        {
            LOG_ERROR_MESSAGE("Another query of the same type is already active in the command buffer. "
                              "Overlapping queries are not allowed in Vulkan. The command will be ignored.");
            return;
        }

        // A query must either begin and end inside the same subpass of a render pass instance, or must both
        // begin and end outside a render pass instance (i.e. contain entire render pass instances)
        // (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004).

        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdBeginQuery(m_VkCmdBuffer, queryPool, query, flags);
        if (IsInRenderScope())
            m_State.InsidePassQueries |= queryFlag;
        else
            m_State.OutsidePassQueries |= queryFlag;
    }